

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  StkId pSVar1;
  char *pcVar2;
  StkId pos;
  StkId local_10;
  
  if (ar == (lua_Debug *)0x0) {
    if (*(char *)((L->top).offset + -8) == 'F') {
      pcVar2 = luaF_getlocalname(*(Proto **)(*(long *)((L->top).offset + -0x10) + 0x18),n,0);
      return pcVar2;
    }
    pcVar2 = (char *)0x0;
  }
  else {
    local_10 = (StkId)0x0;
    pcVar2 = luaG_findlocal(L,ar->i_ci,n,&local_10);
    if (pcVar2 != (char *)0x0) {
      pSVar1 = (L->top).p;
      (pSVar1->val).value_ = (local_10->val).value_;
      (pSVar1->val).tt_ = (local_10->val).tt_;
      (L->top).p = (StkId)((L->top).offset + 0x10);
    }
  }
  return pcVar2;
}

Assistant:

LUA_API const char *lua_getlocal (lua_State *L, const lua_Debug *ar, int n) {
  const char *name;
  lua_lock(L);
  if (ar == NULL) {  /* information about non-active function? */
    if (!isLfunction(s2v(L->top.p - 1)))  /* not a Lua function? */
      name = NULL;
    else  /* consider live variables at function start (parameters) */
      name = luaF_getlocalname(clLvalue(s2v(L->top.p - 1))->p, n, 0);
  }
  else {  /* active function; get information through 'ar' */
    StkId pos = NULL;  /* to avoid warnings */
    name = luaG_findlocal(L, ar->i_ci, n, &pos);
    if (name) {
      setobjs2s(L, L->top.p, pos);
      api_incr_top(L);
    }
  }
  lua_unlock(L);
  return name;
}